

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCII85Decoder.cc
# Opt level: O0

void __thiscall Pl_ASCII85Decoder::flush(Pl_ASCII85Decoder *this)

{
  size_t sVar1;
  Pipeline *pPVar2;
  size_t t;
  undefined1 local_20 [4];
  int i_1;
  uchar outbuf [4];
  int i;
  unsigned_long lval;
  Pl_ASCII85Decoder *this_local;
  
  if (this->pos == 0) {
    QTC::TC("libtests","Pl_ASCII85Decoder no-op flush",0);
  }
  else {
    _outbuf = 0;
    for (i_1 = 0; i_1 < 5; i_1 = i_1 + 1) {
      _outbuf = (ulong)(this->inbuf[i_1] - 0x21) + _outbuf * 0x55;
    }
    memset(local_20,0,4);
    for (t._4_4_ = 3; -1 < t._4_4_; t._4_4_ = t._4_4_ + -1) {
      local_20[t._4_4_] = (char)_outbuf;
      _outbuf = _outbuf >> 8;
    }
    QTC::TC("libtests","Pl_ASCII85Decoder partial flush",(uint)(this->pos != 5));
    sVar1 = this->pos;
    this->pos = 0;
    memset(this->inbuf,0x75,5);
    pPVar2 = Pipeline::next(&this->super_Pipeline);
    (*pPVar2->_vptr_Pipeline[2])(pPVar2,local_20,sVar1 - 1);
  }
  return;
}

Assistant:

void
Pl_ASCII85Decoder::flush()
{
    if (this->pos == 0) {
        QTC::TC("libtests", "Pl_ASCII85Decoder no-op flush");
        return;
    }
    unsigned long lval = 0;
    for (int i = 0; i < 5; ++i) {
        lval *= 85;
        lval += (this->inbuf[i] - 33U);
    }

    unsigned char outbuf[4];
    memset(outbuf, 0, 4);
    for (int i = 3; i >= 0; --i) {
        outbuf[i] = lval & 0xff;
        lval >>= 8;
    }

    QTC::TC("libtests", "Pl_ASCII85Decoder partial flush", (this->pos == 5) ? 0 : 1);
    // Reset before calling getNext()->write in case that throws an exception.
    auto t = this->pos - 1;
    this->pos = 0;
    memset(this->inbuf, 117, 5);

    next()->write(outbuf, t);
}